

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O2

PrimInfoMB * __thiscall
embree::avx512::PointsISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,PointsISA *this,mvector<PrimRefMB> *prims,BBox1f *t0t1
          ,range<unsigned_long> *r,size_t k,uint geomID)

{
  RawBufferView *pRVar1;
  BBox1f BVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  PrimRefMB *pPVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar18;
  ulong uVar19;
  size_t *psVar20;
  long lVar21;
  uint index;
  unsigned_long uVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  size_t itime;
  bool bVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  undefined1 auVar46 [16];
  float fVar47;
  float fVar51;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar52;
  undefined1 auVar50 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar58;
  float fVar59;
  undefined1 auVar57 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  anon_class_16_2_4e716a3c local_190;
  ulong local_180;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  ulong uVar17;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  uVar22 = r->_begin;
  auVar61 = ZEXT464(0x3f800000);
  auVar30._8_4_ = 0x7f800000;
  auVar30._0_8_ = 0x7f8000007f800000;
  auVar30._12_4_ = 0x7f800000;
  auVar69 = ZEXT1664(auVar30);
  auVar29._8_4_ = 0xff800000;
  auVar29._0_8_ = 0xff800000ff800000;
  auVar29._12_4_ = 0xff800000;
  auVar65 = ZEXT1664(auVar29);
  fVar27 = 1.0;
  auVar57 = ZEXT1664(ZEXT816(0) << 0x40);
  uVar25 = 0;
  auVar70 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
  auVar71 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
  fVar28 = 0.0;
  auVar72 = ZEXT1664(auVar29);
  auVar73 = ZEXT1664(auVar30);
  auVar75 = ZEXT1664(auVar29);
  auVar76 = ZEXT1664(auVar30);
  auVar29 = vpxord_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar74 = ZEXT1664(auVar29);
  while( true ) {
    auVar29 = auVar61._0_16_;
    if (r->_end <= uVar22) {
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
      lower.field_0 = auVar76._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
      upper.field_0 = auVar75._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      lower.field_0 = auVar73._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      upper.field_0 = auVar72._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = auVar69._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = auVar65._0_16_;
      BVar2 = (BBox1f)vmovlps_avx(auVar29);
      __return_storage_ptr__->time_range = BVar2;
      auVar29 = vmovdqu64_avx512vl(auVar74._0_16_);
      *(undefined1 (*) [16])&(__return_storage_ptr__->object_range)._end = auVar29;
      __return_storage_ptr__->max_num_time_segments = uVar25;
      (__return_storage_ptr__->max_time_range).lower = fVar28;
      (__return_storage_ptr__->max_time_range).upper = fVar27;
      return __return_storage_ptr__;
    }
    BVar2 = (this->super_Points).super_Geometry.time_range;
    auVar31._8_8_ = 0;
    auVar31._0_4_ = BVar2.lower;
    auVar31._4_4_ = BVar2.upper;
    auVar30 = vmovshdup_avx(auVar31);
    fVar37 = BVar2.lower;
    fVar45 = auVar30._0_4_ - fVar37;
    pBVar3 = (this->super_Points).vertices.items;
    if ((uVar22 & 0xffffffff) < (pBVar3->super_RawBufferView).num) break;
LAB_01c50e46:
    uVar22 = uVar22 + 1;
  }
  fVar35 = (this->super_Points).super_Geometry.fnumTimeSegments;
  auVar30 = vmulss_avx512f(ZEXT416((uint)fVar35),
                           ZEXT416((uint)(((t0t1->upper - fVar37) / fVar45) * 0.99999976)));
  auVar30 = vroundss_avx(auVar30,auVar30,10);
  auVar31 = vminss_avx512f(auVar30,ZEXT416((uint)fVar35));
  fVar47 = (t0t1->lower - fVar37) / fVar45;
  auVar34 = ZEXT416((uint)fVar35);
  auVar30 = vmulss_avx512f(auVar34,ZEXT416((uint)(fVar47 * 1.0000002)));
  auVar30 = vroundss_avx(auVar30,auVar30,9);
  auVar30 = vmaxss_avx(auVar57._0_16_,auVar30);
  psVar20 = &pBVar3[(int)auVar30._0_4_].super_RawBufferView.stride;
  uVar19 = (long)(int)auVar30._0_4_ - 1;
LAB_01c50dfe:
  uVar19 = uVar19 + 1;
  if (uVar19 <= (ulong)(long)(int)auVar31._0_4_) goto code_r0x01c50e06;
  auVar30 = vmovdqa64_avx512vl(auVar74._0_16_);
  local_190.primID = &local_180;
  auVar38._0_4_ = (t0t1->upper - fVar37) / fVar45;
  auVar38._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar32 = vmulss_avx512f(auVar34,ZEXT416((uint)fVar47));
  auVar33 = vmulss_avx512f(auVar34,auVar38);
  auVar68 = vroundss_avx(auVar32,auVar32,9);
  auVar50 = vroundss_avx(auVar33,auVar33,10);
  auVar31 = vmaxss_avx(auVar68,auVar57._0_16_);
  auVar34 = vminss_avx512f(auVar50,auVar34);
  iVar18 = (int)auVar31._0_4_;
  fVar45 = auVar34._0_4_;
  iVar15 = (int)auVar68._0_4_;
  iVar23 = -1;
  if (-1 < iVar15) {
    iVar23 = iVar15;
  }
  iVar24 = vcvttss2si_avx512f(ZEXT416((uint)fVar35));
  iVar14 = iVar24 + 1;
  if ((int)auVar50._0_4_ < iVar24 + 1) {
    iVar14 = (int)auVar50._0_4_;
  }
  local_190.this = &this->super_Points;
  local_180 = uVar22;
  Points::linearBounds::anon_class_16_2_4e716a3c::operator()(&blower0,&local_190,(long)iVar18);
  Points::linearBounds::anon_class_16_2_4e716a3c::operator()(&bupper1,&local_190,(long)(int)fVar45);
  fVar37 = auVar32._0_4_ - auVar31._0_4_;
  if (iVar14 - iVar23 == 1) {
    auVar31 = vmaxss_avx(ZEXT416((uint)fVar37),ZEXT816(0) << 0x40);
    fVar35 = auVar31._0_4_;
    fVar37 = 1.0 - fVar35;
    auVar62._0_4_ = fVar35 * bupper1.lower.field_0._0_4_;
    auVar62._4_4_ = fVar35 * bupper1.lower.field_0._4_4_;
    auVar62._8_4_ = fVar35 * bupper1.lower.field_0._8_4_;
    auVar62._12_4_ = fVar35 * bupper1.lower.field_0._12_4_;
    auVar41._4_4_ = fVar37;
    auVar41._0_4_ = fVar37;
    auVar41._8_4_ = fVar37;
    auVar41._12_4_ = fVar37;
    auVar34 = vfmadd231ps_fma(auVar62,auVar41,(undefined1  [16])blower0.lower.field_0);
    auVar66._0_4_ = fVar35 * bupper1.upper.field_0._0_4_;
    auVar66._4_4_ = fVar35 * bupper1.upper.field_0._4_4_;
    auVar66._8_4_ = fVar35 * bupper1.upper.field_0._8_4_;
    auVar66._12_4_ = fVar35 * bupper1.upper.field_0._12_4_;
    auVar68 = vfmadd231ps_fma(auVar66,(undefined1  [16])blower0.upper.field_0,auVar41);
    auVar31 = vmaxss_avx(ZEXT416((uint)(fVar45 - auVar33._0_4_)),ZEXT816(0) << 0x40);
    fVar37 = auVar31._0_4_;
    fVar45 = 1.0 - fVar37;
    auVar48._0_4_ = fVar37 * blower0.lower.field_0._0_4_;
    auVar48._4_4_ = fVar37 * blower0.lower.field_0._4_4_;
    auVar48._8_4_ = fVar37 * blower0.lower.field_0._8_4_;
    auVar48._12_4_ = fVar37 * blower0.lower.field_0._12_4_;
    auVar42._4_4_ = fVar45;
    auVar42._0_4_ = fVar45;
    auVar42._8_4_ = fVar45;
    auVar42._12_4_ = fVar45;
    auVar50 = vfmadd231ps_fma(auVar48,auVar42,(undefined1  [16])bupper1.lower.field_0);
    auVar53._0_4_ = fVar37 * blower0.upper.field_0._0_4_;
    auVar53._4_4_ = fVar37 * blower0.upper.field_0._4_4_;
    auVar53._8_4_ = fVar37 * blower0.upper.field_0._8_4_;
    auVar53._12_4_ = fVar37 * blower0.upper.field_0._12_4_;
    auVar32 = vfmadd231ps_fma(auVar53,auVar42,(undefined1  [16])bupper1.upper.field_0);
  }
  else {
    Points::linearBounds::anon_class_16_2_4e716a3c::operator()
              (&blower1,&local_190,(long)(iVar18 + 1));
    Points::linearBounds::anon_class_16_2_4e716a3c::operator()
              (&bupper0,&local_190,(long)((int)fVar45 + -1));
    auVar31 = vmaxss_avx(ZEXT416((uint)fVar37),ZEXT816(0) << 0x40);
    fVar36 = auVar31._0_4_;
    fVar37 = 1.0 - fVar36;
    auVar64._0_4_ = fVar36 * blower1.lower.field_0.m128[0];
    auVar64._4_4_ = fVar36 * blower1.lower.field_0.m128[1];
    auVar64._8_4_ = fVar36 * blower1.lower.field_0.m128[2];
    auVar64._12_4_ = fVar36 * blower1.lower.field_0.m128[3];
    auVar43._4_4_ = fVar37;
    auVar43._0_4_ = fVar37;
    auVar43._8_4_ = fVar37;
    auVar43._12_4_ = fVar37;
    auVar34 = vfmadd231ps_fma(auVar64,auVar43,(undefined1  [16])blower0.lower.field_0);
    auVar67._0_4_ = fVar36 * blower1.upper.field_0.m128[0];
    auVar67._4_4_ = fVar36 * blower1.upper.field_0.m128[1];
    auVar67._8_4_ = fVar36 * blower1.upper.field_0.m128[2];
    auVar67._12_4_ = fVar36 * blower1.upper.field_0.m128[3];
    auVar68 = vfmadd231ps_fma(auVar67,auVar43,(undefined1  [16])blower0.upper.field_0);
    auVar31 = vmaxss_avx(ZEXT416((uint)(fVar45 - auVar33._0_4_)),ZEXT816(0) << 0x40);
    fVar37 = auVar31._0_4_;
    fVar45 = 1.0 - fVar37;
    auVar49._0_4_ = fVar37 * bupper0.lower.field_0.m128[0];
    auVar49._4_4_ = fVar37 * bupper0.lower.field_0.m128[1];
    auVar49._8_4_ = fVar37 * bupper0.lower.field_0.m128[2];
    auVar49._12_4_ = fVar37 * bupper0.lower.field_0.m128[3];
    auVar33._4_4_ = fVar45;
    auVar33._0_4_ = fVar45;
    auVar33._8_4_ = fVar45;
    auVar33._12_4_ = fVar45;
    auVar50 = vfmadd231ps_fma(auVar49,auVar33,(undefined1  [16])bupper1.lower.field_0);
    auVar56._0_4_ = fVar37 * bupper0.upper.field_0.m128[0];
    auVar56._4_4_ = fVar37 * bupper0.upper.field_0.m128[1];
    auVar56._8_4_ = fVar37 * bupper0.upper.field_0.m128[2];
    auVar56._12_4_ = fVar37 * bupper0.upper.field_0.m128[3];
    auVar32 = vfmadd231ps_fma(auVar56,auVar33,(undefined1  [16])bupper1.upper.field_0);
    if (iVar15 < 0) {
      iVar15 = -1;
    }
    itime = (size_t)iVar15;
    while (itime = itime + 1, (long)itime < (long)iVar14) {
      fVar37 = ((float)(int)itime / fVar35 - fVar47) / (auVar38._0_4_ - fVar47);
      fVar45 = 1.0 - fVar37;
      auVar46._0_4_ = auVar50._0_4_ * fVar37;
      fVar36 = auVar50._4_4_;
      auVar46._4_4_ = fVar36 * fVar37;
      fVar51 = auVar50._8_4_;
      auVar46._8_4_ = fVar51 * fVar37;
      fVar52 = auVar50._12_4_;
      auVar46._12_4_ = fVar52 * fVar37;
      auVar44._4_4_ = fVar45;
      auVar44._0_4_ = fVar45;
      auVar44._8_4_ = fVar45;
      auVar44._12_4_ = fVar45;
      auVar31 = vfmadd231ps_fma(auVar46,auVar44,auVar34);
      auVar40._0_4_ = auVar32._0_4_ * fVar37;
      fVar45 = auVar32._4_4_;
      auVar40._4_4_ = fVar45 * fVar37;
      fVar58 = auVar32._8_4_;
      auVar40._8_4_ = fVar58 * fVar37;
      fVar59 = auVar32._12_4_;
      auVar40._12_4_ = fVar59 * fVar37;
      auVar33 = vfmadd231ps_fma(auVar40,auVar68,auVar44);
      Points::linearBounds::anon_class_16_2_4e716a3c::operator()(&bi,&local_190,itime);
      local_1f8 = auVar68._0_4_;
      fStack_1f4 = auVar68._4_4_;
      fStack_1f0 = auVar68._8_4_;
      fStack_1ec = auVar68._12_4_;
      local_1e8 = auVar34._0_4_;
      fStack_1e4 = auVar34._4_4_;
      fStack_1e0 = auVar34._8_4_;
      fStack_1dc = auVar34._12_4_;
      auVar31 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar31);
      auVar34 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar33);
      auVar68 = vminps_avx(auVar31,ZEXT816(0) << 0x40);
      auVar31 = vmaxps_avx(auVar34,ZEXT816(0) << 0x40);
      auVar34._0_4_ = local_1e8 + auVar68._0_4_;
      auVar34._4_4_ = fStack_1e4 + auVar68._4_4_;
      auVar34._8_4_ = fStack_1e0 + auVar68._8_4_;
      auVar34._12_4_ = fStack_1dc + auVar68._12_4_;
      auVar50._0_4_ = auVar50._0_4_ + auVar68._0_4_;
      auVar50._4_4_ = fVar36 + auVar68._4_4_;
      auVar50._8_4_ = fVar51 + auVar68._8_4_;
      auVar50._12_4_ = fVar52 + auVar68._12_4_;
      auVar68._0_4_ = local_1f8 + auVar31._0_4_;
      auVar68._4_4_ = fStack_1f4 + auVar31._4_4_;
      auVar68._8_4_ = fStack_1f0 + auVar31._8_4_;
      auVar68._12_4_ = fStack_1ec + auVar31._12_4_;
      auVar32._0_4_ = auVar32._0_4_ + auVar31._0_4_;
      auVar32._4_4_ = fVar45 + auVar31._4_4_;
      auVar32._8_4_ = fVar58 + auVar31._8_4_;
      auVar32._12_4_ = fVar59 + auVar31._12_4_;
    }
  }
  aVar8 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar34,ZEXT416(geomID),0x30);
  uVar16 = (this->super_Points).super_Geometry.numTimeSteps - 1;
  uVar17 = (ulong)uVar16;
  BVar2 = (this->super_Points).super_Geometry.time_range;
  auVar39._8_8_ = 0;
  auVar39._0_4_ = BVar2.lower;
  auVar39._4_4_ = BVar2.upper;
  aVar9 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar68,ZEXT416((uint)uVar22),0x30);
  aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
           vinsertps_avx(auVar50,ZEXT416(uVar16),0x30);
  aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
           vinsertps_avx(auVar32,ZEXT416(uVar16),0x30);
  auVar63._8_4_ = 0x3f000000;
  auVar63._0_8_ = 0x3f0000003f000000;
  auVar63._12_4_ = 0x3f000000;
  auVar54._0_4_ = aVar10.x * 0.5;
  auVar54._4_4_ = aVar10.y * 0.5;
  auVar54._8_4_ = aVar10.z * 0.5;
  auVar54._12_4_ = aVar10.field_3.w * 0.5;
  auVar31 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar8,auVar63);
  auVar60._0_4_ = aVar11.x * 0.5;
  auVar60._4_4_ = aVar11.y * 0.5;
  auVar60._8_4_ = aVar11.z * 0.5;
  auVar60._12_4_ = aVar11.field_3.w * 0.5;
  auVar34 = vfmadd231ps_fma(auVar60,(undefined1  [16])aVar9,auVar63);
  auVar55._0_4_ = auVar31._0_4_ + auVar34._0_4_;
  auVar55._4_4_ = auVar31._4_4_ + auVar34._4_4_;
  auVar55._8_4_ = auVar31._8_4_ + auVar34._8_4_;
  auVar55._12_4_ = auVar31._12_4_ + auVar34._12_4_;
  auVar31 = vminps_avx512vl((undefined1  [16])auVar76._0_16_,(undefined1  [16])aVar8);
  auVar76 = ZEXT1664(auVar31);
  auVar31 = vmaxps_avx512vl((undefined1  [16])auVar75._0_16_,(undefined1  [16])aVar9);
  auVar75 = ZEXT1664(auVar31);
  auVar31 = vminps_avx512vl((undefined1  [16])auVar73._0_16_,(undefined1  [16])aVar10);
  auVar73 = ZEXT1664(auVar31);
  auVar31 = vmaxps_avx((undefined1  [16])auVar72._0_16_,(undefined1  [16])aVar11);
  auVar72 = ZEXT1664(auVar31);
  auVar31 = vminps_avx((undefined1  [16])auVar69._0_16_,auVar55);
  auVar69 = ZEXT1664(auVar31);
  auVar31 = vmaxps_avx((undefined1  [16])auVar65._0_16_,auVar55);
  auVar65 = ZEXT1664(auVar31);
  uVar19 = vcmpps_avx512vl(auVar29,auVar39,1);
  auVar31 = vinsertps_avx(auVar29,auVar39,0x50);
  auVar29 = vblendps_avx(auVar39,auVar29,2);
  bVar26 = (bool)((byte)uVar19 & 1);
  bVar5 = (bool)((byte)(uVar19 >> 1) & 1);
  bVar6 = (bool)((byte)(uVar19 >> 2) & 1);
  bVar7 = (bool)((byte)(uVar19 >> 3) & 1);
  auVar61 = ZEXT1664(CONCAT412((uint)bVar7 * auVar31._12_4_ | (uint)!bVar7 * auVar29._12_4_,
                               CONCAT48((uint)bVar6 * auVar31._8_4_ | (uint)!bVar6 * auVar29._8_4_,
                                        CONCAT44((uint)bVar5 * auVar31._4_4_ |
                                                 (uint)!bVar5 * auVar29._4_4_,
                                                 (uint)bVar26 * auVar31._0_4_ |
                                                 (uint)!bVar26 * auVar29._0_4_))));
  auVar29 = vpmovsxbq_avx(ZEXT216(0x101));
  auVar29 = vpinsrq_avx(auVar29,uVar17,1);
  auVar30 = vmovdqa64_avx512vl(auVar30);
  auVar29 = vpaddq_avx512vl(auVar30,auVar29);
  auVar74 = ZEXT1664(auVar29);
  bVar26 = uVar25 < uVar17;
  auVar29 = vmovshdup_avx(auVar39);
  fVar27 = (float)((uint)bVar26 * auVar29._0_4_ + (uint)!bVar26 * (int)fVar27);
  fVar28 = (float)((uint)bVar26 * (int)BVar2.lower + (uint)!bVar26 * (int)fVar28);
  if (uVar25 <= uVar17) {
    uVar25 = uVar17;
  }
  pPVar4 = prims->items;
  pPVar4[k].lbounds.bounds0.lower.field_0 = aVar8;
  pPVar4[k].lbounds.bounds0.upper.field_0 = aVar9;
  pPVar4[k].lbounds.bounds1.lower.field_0.field_1 = aVar10;
  pPVar4[k].lbounds.bounds1.upper.field_0.field_1 = aVar11;
  pPVar4[k].time_range = BVar2;
  auVar57 = ZEXT864(0) << 0x20;
  auVar70 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
  auVar71 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
  k = k + 1;
  goto LAB_01c50e46;
code_r0x01c50e06:
  pRVar1 = (RawBufferView *)(psVar20 + -2);
  lVar21 = *psVar20 * (uVar22 & 0xffffffff);
  auVar30 = *(undefined1 (*) [16])(pRVar1->ptr_ofs + lVar21);
  uVar12 = vcmpps_avx512vl(auVar30,auVar70._0_16_,6);
  uVar13 = vcmpps_avx512vl(auVar30,auVar71._0_16_,1);
  if (((byte)((byte)uVar12 & (byte)uVar13) != 0xf) ||
     (psVar20 = psVar20 + 7, *(float *)(pRVar1->ptr_ofs + lVar21 + 0xc) < 0.0)) goto LAB_01c50e46;
  goto LAB_01c50dfe;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims,
                                      const BBox1f& t0t1,
                                      const range<size_t>& r,
                                      size_t k,
                                      unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          if (!valid(j, timeSegmentRange(t0t1)))
            continue;
          const PrimRefMB prim(linearBounds(j, t0t1), this->numTimeSegments(), this->time_range, this->numTimeSegments(), geomID, unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }